

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O1

uint64_t __thiscall roaring::Roaring64Map::rank(Roaring64Map *this,uint64_t x)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_color _Var2;
  uint64_t uVar3;
  uint64_t uVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  bool bVar7;
  
  p_Var1 = &(this->roarings)._M_t._M_impl.super__Rb_tree_header;
  _Var2 = (_Rb_tree_color)(x >> 0x20);
  p_Var5 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var5 != (_Rb_tree_node_base *)0x0; p_Var5 = (&p_Var5->_M_left)[bVar7]) {
    bVar7 = p_Var5[1]._M_color < _Var2;
    if (!bVar7) {
      p_Var6 = p_Var5;
    }
  }
  if (((_Rb_tree_header *)p_Var6 == p_Var1) || (p_Var6[1]._M_color != _Var2)) {
    uVar3 = 0;
  }
  else {
    uVar3 = roaring_bitmap_rank((roaring_bitmap_t *)&p_Var6[1]._M_parent,(uint32_t)x);
  }
  for (p_Var5 = (this->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var5 != p_Var6; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    uVar4 = roaring_bitmap_get_cardinality((roaring_bitmap_t *)&p_Var5[1]._M_parent);
    uVar3 = uVar3 + uVar4;
  }
  return uVar3;
}

Assistant:

uint64_t rank(uint64_t x) const {
        uint64_t result = 0;
        // Find the first bitmap >= x's bucket. If that is the bucket x would be
        // in, find it's rank in that bucket. Either way, we're left with a
        // range of all buckets strictly smaller than x's bucket, add all their
        // cardinalities together.
        auto end = roarings.lower_bound(highBytes(x));
        if (end != roarings.cend() && end->first == highBytes(x)) {
            result += end->second.rank(lowBytes(x));
        }
        for (auto iter = roarings.cbegin(); iter != end; ++iter) {
            result += iter->second.cardinality();
        }
        return result;
    }